

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

FILE * pugi::impl::anon_unknown_0::open_file_wide(wchar_t *path,wchar_t *mode)

{
  long lVar1;
  size_t i;
  value_type vVar2;
  char *__filename;
  value_type puVar3;
  long lVar4;
  FILE *pFVar5;
  char mode_ascii [4];
  
  if (path == (wchar_t *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0x1399,
                  "char *pugi::impl::(anonymous namespace)::convert_path_heap(const wchar_t *)");
  }
  lVar4 = -4;
  do {
    lVar1 = lVar4 + 4;
    lVar4 = lVar4 + 4;
  } while (*(int *)((long)path + lVar1) != 0);
  vVar2 = utf32_decoder<pugi::impl::(anonymous_namespace)::opt_false>::
          process<pugi::impl::(anonymous_namespace)::utf8_counter>(path,lVar4 >> 2);
  __filename = (char *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>
                                 ::allocate)(vVar2 + 1);
  if (__filename == (char *)0x0) {
    pFVar5 = (FILE *)0x0;
  }
  else {
    puVar3 = utf32_decoder<pugi::impl::(anonymous_namespace)::opt_false>::
             process<pugi::impl::(anonymous_namespace)::utf8_writer>(path,lVar4 >> 2,__filename);
    if ((value_type)(__filename + vVar2) != puVar3) {
      __assert_fail("begin + size == end",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                    ,0x905,
                    "void pugi::impl::(anonymous namespace)::as_utf8_end(char *, size_t, const wchar_t *, size_t)"
                   );
    }
    __filename[vVar2] = '\0';
    mode_ascii[0] = '\0';
    mode_ascii[1] = '\0';
    mode_ascii[2] = '\0';
    mode_ascii[3] = '\0';
    for (lVar4 = 0; mode[lVar4] != L'\0'; lVar4 = lVar4 + 1) {
      mode_ascii[lVar4] = (char)mode[lVar4];
    }
    pFVar5 = fopen(__filename,mode_ascii);
    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              (__filename);
  }
  return (FILE *)pFVar5;
}

Assistant:

PUGI__FN char* convert_path_heap(const wchar_t* str)
	{
		assert(str);

		// first pass: get length in utf8 characters
		size_t length = strlength_wide(str);
		size_t size = as_utf8_begin(str, length);

		// allocate resulting string
		char* result = static_cast<char*>(xml_memory::allocate(size + 1));
		if (!result) return 0;

		// second pass: convert to utf8
		as_utf8_end(result, size, str, length);

		// zero-terminate
		result[size] = 0;

		return result;
	}